

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

Split * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::find(Split *__return_storage_ptr__,
      BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMvMB<4>_>,_embree::Scene::BuildProgressMonitorInterface>
      *this,SetMB *set)

{
  size_t logBlockSize;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  Split object_split;
  Split local_68;
  
  HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
            (&local_68,(HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *)&this->field_0x40,set,
             (this->cfg).logBlockSize);
  fVar5 = local_68.sah;
  fVar4 = (set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower;
  auVar3 = vsubps_avx((undefined1  [16])
                      (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                      geomBounds.bounds0.upper.field_0,
                      (undefined1  [16])
                      (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                      geomBounds.bounds0.lower.field_0);
  auVar7 = vsubps_avx((undefined1  [16])
                      (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                      geomBounds.bounds1.upper.field_0,
                      (undefined1  [16])
                      (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                      geomBounds.bounds1.lower.field_0);
  logBlockSize = (this->cfg).logBlockSize;
  auVar1 = vinsertps_avx(auVar7,auVar3,0x4c);
  auVar2 = vshufpd_avx(auVar3,auVar3,1);
  auVar2 = vinsertps_avx(auVar2,auVar7,0x9c);
  auVar3 = vinsertps_avx(auVar3,auVar7,0x1c);
  auVar7._0_4_ = auVar3._0_4_ * (auVar1._0_4_ + auVar2._0_4_) + auVar1._0_4_ * auVar2._0_4_;
  auVar7._4_4_ = auVar3._4_4_ * (auVar1._4_4_ + auVar2._4_4_) + auVar1._4_4_ * auVar2._4_4_;
  auVar7._8_4_ = auVar3._8_4_ * (auVar1._8_4_ + auVar2._8_4_) + auVar1._8_4_ * auVar2._8_4_;
  auVar7._12_4_ = auVar3._12_4_ * (auVar1._12_4_ + auVar2._12_4_) + auVar1._12_4_ * auVar2._12_4_;
  auVar1 = vhaddps_avx(auVar7,auVar7);
  bVar6 = (byte)logBlockSize;
  if (((local_68.sah <
        fVar4 * auVar1._0_4_ * 0.5 *
        (float)(~(-1L << (bVar6 & 0x3f)) + (set->super_PrimInfoMB).num_time_segments >>
               (bVar6 & 0x3f)) * 0.5) ||
      (fVar4 <= 1.01 / (float)(set->super_PrimInfoMB).max_num_time_segments)) ||
     (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
      ::find(__return_storage_ptr__,&this->heuristicTemporalSplit,set,logBlockSize),
     fVar5 <= __return_storage_ptr__->sah)) {
    __return_storage_ptr__->sah = local_68.sah;
    __return_storage_ptr__->dim = local_68.dim;
    __return_storage_ptr__->field_2 = local_68.field_2;
    __return_storage_ptr__->data = local_68.data;
    (__return_storage_ptr__->mapping).num = local_68.mapping.num;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 =
         local_68.mapping.ofs.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         local_68.mapping.ofs.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 =
         local_68.mapping.scale.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         local_68.mapping.scale.field_0._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set)
          {
            /* first try standard object split */
            const Split object_split = heuristicObjectSplit.find(set,cfg.logBlockSize);
            const float object_split_sah = object_split.splitSAH();

            /* test temporal splits only when object split was bad */
            const float leaf_sah = set.leafSAH(cfg.logBlockSize);
            if (object_split_sah < 0.50f*leaf_sah)
              return object_split;

            /* do temporal splits only if the time range is big enough */
            if (set.time_range.size() > 1.01f/float(set.max_num_time_segments))
            {
              const Split temporal_split = heuristicTemporalSplit.find(set,cfg.logBlockSize);
              const float temporal_split_sah = temporal_split.splitSAH();

              /* take temporal split if it improved SAH */
              if (temporal_split_sah < object_split_sah)
                return temporal_split;
            }

            return object_split;
          }